

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

uint Kit_DsdGetSupports(Kit_DsdNtk_t *p)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint *puVar5;
  Kit_DsdObj_t *pKVar6;
  uint uVar7;
  
  if (p->pSupps != (uint *)0x0) {
    __assert_fail("p->pSupps == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x6e7,"unsigned int Kit_DsdGetSupports(Kit_DsdNtk_t *)");
  }
  uVar1 = p->nNodes;
  puVar5 = (uint *)malloc((ulong)((uint)uVar1 * 4));
  p->pSupps = puVar5;
  uVar2 = p->Root;
  uVar4 = uVar2 >> 1;
  uVar3 = p->nVars;
  if ((uint)uVar3 + (uint)uVar1 <= (uint)uVar4) {
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  if (uVar4 < uVar3) {
    pKVar6 = (Kit_DsdObj_t *)0x0;
  }
  else {
    pKVar6 = p->pNodes[(ulong)(uint)uVar4 - (ulong)uVar3];
  }
  if (((uint)*pKVar6 & 0x1c0) == 0x40) {
    if (uVar1 != 1) {
      __assert_fail("p->nNodes == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x6ed,"unsigned int Kit_DsdGetSupports(Kit_DsdNtk_t *)");
    }
    *puVar5 = 0;
  }
  if (((uint)*pKVar6 & 0x1c0) == 0x80) {
    if (uVar1 != 1) {
      __assert_fail("p->nNodes == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x6f2,"unsigned int Kit_DsdGetSupports(Kit_DsdNtk_t *)");
    }
    uVar2 = *(ushort *)(pKVar6 + 1) >> 1;
    if ((uint)uVar3 + (uint)uVar1 <= (uint)uVar2) {
      __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                    ,0x9c,"unsigned int Kit_DsdLitSupport(Kit_DsdNtk_t *, int)");
    }
    if (puVar5 == (uint *)0x0) {
      uVar7 = 0;
    }
    else if (uVar2 < uVar3) {
      uVar7 = 1 << ((byte)uVar2 & 0x1f);
    }
    else {
      uVar7 = puVar5[(ulong)(uint)uVar2 - (ulong)uVar3];
    }
    *puVar5 = uVar7;
  }
  else {
    uVar7 = Kit_DsdGetSupports_rec(p,(uint)uVar2);
  }
  if (uVar7 < 0x10000) {
    return uVar7;
  }
  __assert_fail("uSupport <= 0xFFFF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                ,0x6f7,"unsigned int Kit_DsdGetSupports(Kit_DsdNtk_t *)");
}

Assistant:

unsigned Kit_DsdGetSupports( Kit_DsdNtk_t * p )
{
    Kit_DsdObj_t * pRoot;
    unsigned uSupport;
    assert( p->pSupps == NULL );
    p->pSupps = ABC_ALLOC( unsigned, p->nNodes );
    // consider simple special cases
    pRoot = Kit_DsdNtkRoot(p);
    if ( pRoot->Type == KIT_DSD_CONST1 )
    {
        assert( p->nNodes == 1 );
        uSupport = p->pSupps[0] = 0;
    }
    if ( pRoot->Type == KIT_DSD_VAR )
    {
        assert( p->nNodes == 1 );
        uSupport = p->pSupps[0] = Kit_DsdLitSupport( p, pRoot->pFans[0] );
    }
    else
        uSupport = Kit_DsdGetSupports_rec( p, p->Root );
    assert( uSupport <= 0xFFFF );
    return uSupport;
}